

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceGLImpl::CreateDeviceMemory
          (RenderDeviceGLImpl *this,DeviceMemoryCreateInfo *CreateInfo,IDeviceMemory **ppMemory)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  IDeviceMemory **ppMemory_local;
  DeviceMemoryCreateInfo *CreateInfo_local;
  RenderDeviceGLImpl *this_local;
  
  msg.field_2._8_8_ = ppMemory;
  FormatString<char[46]>
            ((string *)local_40,(char (*) [46])"CreateDeviceMemory is not supported in OpenGL");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"CreateDeviceMemory",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x282);
  std::__cxx11::string::~string((string *)local_40);
  *(undefined8 *)msg.field_2._8_8_ = 0;
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateDeviceMemory(const DeviceMemoryCreateInfo& CreateInfo, IDeviceMemory** ppMemory)
{
    UNSUPPORTED("CreateDeviceMemory is not supported in OpenGL");
    *ppMemory = nullptr;
}